

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O1

void AccumulateRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int rgb_stride,
                   uint16_t *dst,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  
  iVar13 = width >> 1;
  lVar18 = (long)rgb_stride;
  if (iVar13 < 1) {
    uVar9 = 0;
  }
  else {
    lVar11 = (long)(rgb_stride + 4);
    uVar15 = 0;
    do {
      bVar1 = a_ptr[uVar15];
      bVar2 = a_ptr[uVar15 + lVar18];
      bVar3 = a_ptr[uVar15 + 4];
      uVar17 = (uint)a_ptr[uVar15 + lVar18 + 4] + (uint)bVar3 + (uint)bVar2 + (uint)bVar1;
      if ((uVar17 == 0x3fc) || (uVar17 == 0)) {
        uVar10 = (uint)kGammaToLinearTab[r_ptr[uVar15 + lVar11]] +
                 (uint)kGammaToLinearTab[r_ptr[uVar15 + lVar18]] +
                 (uint)kGammaToLinearTab[r_ptr[uVar15 + 4]] + (uint)kGammaToLinearTab[r_ptr[uVar15]]
        ;
        uVar8 = uVar10 & 0x1ff;
        uVar9 = (ulong)(uVar10 >> 9);
        iVar7 = uVar8 * kLinearToGammaTab[uVar9 + 1] + (0x200 - uVar8) * kLinearToGammaTab[uVar9];
        uVar10 = (uint)kGammaToLinearTab[g_ptr[uVar15 + lVar11]] +
                 (uint)kGammaToLinearTab[g_ptr[uVar15 + lVar18]] +
                 (uint)kGammaToLinearTab[g_ptr[uVar15 + 4]] + (uint)kGammaToLinearTab[g_ptr[uVar15]]
        ;
        uVar8 = uVar10 & 0x1ff;
        uVar9 = (ulong)(uVar10 >> 9);
        iVar12 = uVar8 * kLinearToGammaTab[uVar9 + 1] + (0x200 - uVar8) * kLinearToGammaTab[uVar9];
        uVar8 = (uint)kGammaToLinearTab[b_ptr[uVar15 + lVar11]] +
                (uint)kGammaToLinearTab[b_ptr[uVar15 + lVar18]] +
                (uint)kGammaToLinearTab[b_ptr[uVar15 + 4]] + (uint)kGammaToLinearTab[b_ptr[uVar15]];
        uVar10 = uVar8 >> 9;
      }
      else {
        uVar8 = (uint)a_ptr[uVar15 + lVar11];
        uVar6 = kInvAlpha[uVar17];
        uVar16 = (kGammaToLinearTab[r_ptr[uVar15 + lVar11]] * uVar8 +
                  (uint)kGammaToLinearTab[r_ptr[uVar15 + lVar18]] * (uint)bVar2 +
                 (uint)kGammaToLinearTab[r_ptr[uVar15 + 4]] * (uint)bVar3 +
                 (uint)kGammaToLinearTab[r_ptr[uVar15]] * (uint)bVar1) * uVar6;
        uVar10 = uVar16 >> 0x11 & 0x1ff;
        uVar9 = (ulong)(uVar16 >> 0x1a);
        iVar7 = uVar10 * kLinearToGammaTab[uVar9 + 1] + (0x200 - uVar10) * kLinearToGammaTab[uVar9];
        uVar10 = (kGammaToLinearTab[g_ptr[uVar15 + lVar11]] * uVar8 +
                  (uint)kGammaToLinearTab[g_ptr[uVar15 + lVar18]] * (uint)bVar2 +
                 (uint)kGammaToLinearTab[g_ptr[uVar15 + 4]] * (uint)bVar3 +
                 (uint)kGammaToLinearTab[g_ptr[uVar15]] * (uint)bVar1) * uVar6;
        uVar16 = uVar10 >> 0x11 & 0x1ff;
        uVar9 = (ulong)(uVar10 >> 0x1a);
        iVar12 = uVar16 * kLinearToGammaTab[uVar9 + 1] + (0x200 - uVar16) * kLinearToGammaTab[uVar9]
        ;
        uVar10 = (kGammaToLinearTab[b_ptr[uVar15 + lVar11]] * uVar8 +
                  (uint)kGammaToLinearTab[b_ptr[uVar15 + lVar18]] * (uint)bVar2 +
                 (uint)kGammaToLinearTab[b_ptr[uVar15 + 4]] * (uint)bVar3 +
                 (uint)kGammaToLinearTab[b_ptr[uVar15]] * (uint)bVar1) * uVar6;
        uVar8 = uVar10 >> 0x11;
        uVar10 = uVar10 >> 0x1a;
      }
      iVar4 = kLinearToGammaTab[(ulong)uVar10 + 1];
      iVar5 = kLinearToGammaTab[uVar10];
      *(short *)((long)dst + uVar15) = (short)(iVar7 + 0x40U >> 7);
      *(short *)((long)dst + uVar15 + 2) = (short)(iVar12 + 0x40U >> 7);
      *(short *)((long)dst + uVar15 + 4) =
           (short)((uVar8 & 0x1ff) * iVar4 + (0x200 - (uVar8 & 0x1ff)) * iVar5 + 0x40 >> 7);
      *(short *)((long)dst + uVar15 + 6) = (short)uVar17;
      uVar15 = uVar15 + 8;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    uVar9 = uVar15 & 0xffffffff;
    dst = (uint16_t *)((long)dst + uVar15);
  }
  if ((width & 1U) != 0) {
    bVar1 = a_ptr[uVar9];
    bVar2 = a_ptr[lVar18 + uVar9];
    iVar13 = (uint)bVar2 + (uint)bVar1;
    if ((iVar13 == 0x1fe) || (iVar13 == 0)) {
      uVar17 = (uint)kGammaToLinearTab[r_ptr[lVar18 + uVar9]] +
               (uint)kGammaToLinearTab[r_ptr[uVar9]] & 0xff;
      uVar15 = (ulong)((uint)kGammaToLinearTab[r_ptr[lVar18 + uVar9]] +
                       (uint)kGammaToLinearTab[r_ptr[uVar9]] >> 8);
      uVar8 = (uint)kGammaToLinearTab[g_ptr[lVar18 + uVar9]] + (uint)kGammaToLinearTab[g_ptr[uVar9]]
              & 0xff;
      uVar14 = (ulong)((uint)kGammaToLinearTab[g_ptr[lVar18 + uVar9]] +
                       (uint)kGammaToLinearTab[g_ptr[uVar9]] >> 8);
      iVar12 = kLinearToGammaTab[uVar15 + 1] * uVar17 * 2 +
               (uVar17 * -2 + 0x200) * kLinearToGammaTab[uVar15];
      uVar17 = uVar8 * 2 * kLinearToGammaTab[uVar14 + 1] + 0x40 +
               (uVar8 * -2 + 0x200) * kLinearToGammaTab[uVar14];
      uVar10 = (uint)kGammaToLinearTab[b_ptr[lVar18 + uVar9]] +
               (uint)kGammaToLinearTab[b_ptr[uVar9]] >> 8;
      uVar8 = ((uint)kGammaToLinearTab[b_ptr[lVar18 + uVar9]] +
               (uint)kGammaToLinearTab[b_ptr[uVar9]] & 0xff) * 2;
    }
    else {
      uVar6 = kInvAlpha[(uint)(iVar13 * 2)];
      uVar8 = ((uint)kGammaToLinearTab[r_ptr[lVar18 + uVar9]] * (uint)bVar2 +
              (uint)kGammaToLinearTab[r_ptr[uVar9]] * (uint)bVar1) * uVar6;
      uVar17 = uVar8 >> 0x10 & 0x1ff;
      uVar15 = (ulong)(uVar8 >> 0x17 & 0xfc);
      uVar8 = ((uint)kGammaToLinearTab[g_ptr[lVar18 + uVar9]] * (uint)bVar2 +
              (uint)kGammaToLinearTab[g_ptr[uVar9]] * (uint)bVar1) * uVar6;
      uVar14 = (ulong)(uVar8 >> 0x17 & 0xfc);
      uVar8 = uVar8 >> 0x10 & 0x1ff;
      iVar12 = *(int *)((long)kLinearToGammaTab + uVar15 + 4) * uVar17 +
               (0x200 - uVar17) * *(int *)((long)kLinearToGammaTab + uVar15);
      uVar17 = uVar8 * *(int *)((long)kLinearToGammaTab + uVar14 + 4) + 0x40 +
               (0x200 - uVar8) * *(int *)((long)kLinearToGammaTab + uVar14);
      uVar10 = ((uint)kGammaToLinearTab[b_ptr[lVar18 + uVar9]] * (uint)bVar2 +
               (uint)kGammaToLinearTab[b_ptr[uVar9]] * (uint)bVar1) * uVar6;
      uVar8 = uVar10 >> 0x10 & 0x1ff;
      uVar10 = uVar10 >> 0x19 & 0x3f;
    }
    iVar7 = kLinearToGammaTab[(ulong)uVar10 + 1];
    iVar4 = kLinearToGammaTab[uVar10];
    *dst = (uint16_t)(iVar12 + 0x40U >> 7);
    dst[1] = (uint16_t)(uVar17 >> 7);
    dst[2] = (uint16_t)(iVar7 * uVar8 + (0x200 - uVar8) * iVar4 + 0x40 >> 7);
    dst[3] = (uint16_t)(iVar13 * 2);
  }
  return;
}

Assistant:

static WEBP_INLINE void AccumulateRGBA(const uint8_t* const r_ptr,
                                       const uint8_t* const g_ptr,
                                       const uint8_t* const b_ptr,
                                       const uint8_t* const a_ptr,
                                       int rgb_stride,
                                       uint16_t* dst, int width) {
  int i, j;
  // we loop over 2x2 blocks and produce one R/G/B/A value for each.
  for (i = 0, j = 0; i < (width >> 1); i += 1, j += 2 * 4, dst += 4) {
    const uint32_t a = SUM4ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM4(r_ptr + j, 4);
      g = SUM4(g_ptr + j, 4);
      b = SUM4(b_ptr + j, 4);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 4, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 4, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 4, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
  if (width & 1) {
    const uint32_t a = 2u * SUM2ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM2(r_ptr + j);
      g = SUM2(g_ptr + j);
      b = SUM2(b_ptr + j);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 0, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 0, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 0, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
}